

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

string * __thiscall
testing::internal::FormatCxxExceptionMessage_abi_cxx11_
          (string *__return_storage_ptr__,internal *this,char *description,char *location)

{
  size_t sVar1;
  string *psVar2;
  long lVar3;
  char *pcVar4;
  ostream *poVar5;
  undefined1 *puVar6;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_30;
  
  Message::Message((Message *)&local_30);
  poVar5 = (ostream *)&(local_30._M_head_impl)->field_0x10;
  if (this == (internal *)0x0) {
    lVar3 = 0x15;
    pcVar4 = "Unknown C++ exception";
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,"C++ exception with description \"",0x20);
    puVar6 = &(local_30._M_head_impl)->field_0x10;
    sVar1 = strlen((char *)this);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar6,(char *)this,sVar1);
    poVar5 = (ostream *)&(local_30._M_head_impl)->field_0x10;
    lVar3 = 1;
    pcVar4 = "\"";
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar4,lVar3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&(local_30._M_head_impl)->field_0x10," thrown in ",0xb);
  puVar6 = &(local_30._M_head_impl)->field_0x10;
  if (description == (char *)0x0) {
    sVar1 = 6;
    description = "(null)";
  }
  else {
    sVar1 = strlen(description);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar6,description,sVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&(local_30._M_head_impl)->field_0x10,".",1);
  psVar2 = StringStreamToString(__return_storage_ptr__,local_30._M_head_impl);
  if (local_30._M_head_impl != (stringstream *)0x0) {
    psVar2 = (string *)(**(code **)(*(long *)local_30._M_head_impl + 8))();
  }
  return psVar2;
}

Assistant:

static std::string FormatCxxExceptionMessage(const char* description,
                                             const char* location) {
  Message message;
  if (description != nullptr) {
    message << "C++ exception with description \"" << description << "\"";
  } else {
    message << "Unknown C++ exception";
  }
  message << " thrown in " << location << ".";

  return message.GetString();
}